

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O0

void __thiscall
SourceMapTest_SourceMapSourceRootFile_Test::~SourceMapTest_SourceMapSourceRootFile_Test
          (SourceMapTest_SourceMapSourceRootFile_Test *this)

{
  SourceMapTest_SourceMapSourceRootFile_Test *this_local;
  
  ~SourceMapTest_SourceMapSourceRootFile_Test(this);
  operator_delete(this,0x428);
  return;
}

Assistant:

TEST_F(SourceMapTest, SourceMapSourceRootFile) {
  std::string sourceMap = R"(
    {
      "version":3,
      "file": "foo.wasm",
      "sources":[],
      "names":[],
      "mappings": "",
      "sourceRoot": "/foo/bar"
    }
  )";
  parseMap(sourceMap);
  EXPECT_EQ(wasm.debugInfoSourceRoot, "/foo/bar");
  EXPECT_EQ(wasm.debugInfoFile, "foo.wasm");
}